

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O2

void __thiscall CDT::test(CDT *this,ostream *out,DataSet *dataset)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  ostream *poVar2;
  uint i;
  uint index;
  uint uVar3;
  ulong uVar4;
  double __x;
  double dVar5;
  double dVar6;
  Shape SVar7;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> matrices;
  
  SVar7 = DataSet::shape(dataset);
  DataSet::compile(&matrices,dataset,1);
  uVar3 = 0;
  for (index = 0; SVar7.n_row != index; index = index + 1) {
    pvVar1 = Matrix<double>::operator[]
                       (matrices.
                        super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl
                        .super__Vector_impl_data._M_start,index);
    __x = feed_forward(this,pvVar1);
    pvVar1 = Matrix<double>::operator[]
                       (matrices.
                        super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl
                        .super__Vector_impl_data._M_start + 1,index);
    dVar5 = ceil(__x);
    dVar6 = floor(__x);
    uVar4 = -(ulong)(dVar5 - __x < 0.5);
    uVar3 = uVar3 + ((int)((double)(~uVar4 & (ulong)dVar6 | (ulong)dVar5 & uVar4) -
                          *(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start) == 0);
  }
  std::operator<<(out,"Accuracy: ");
  poVar2 = std::ostream::_M_insert<double>((double)uVar3 / (double)(SVar7._0_8_ & 0xffffffff));
  std::operator<<(poVar2,'\n');
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::~vector(&matrices);
  return;
}

Assistant:

void CDT::test(std::ostream& out, const DataSet& dataset) const{
    unsigned all_guesses=dataset.shape().n_row;
    unsigned right_guesses=0;

    std::vector<Matrix_d> matrices=dataset.compile();
    for(unsigned i=0;i<all_guesses;++i){
        double output=predict(matrices[0][i]);
        // std::cout<<" : "<<output<<" vs "<<matrices[1][i][0]<<'\n';
        if(ceil(output)-output<0.5) output=ceil(output);
        else output=floor(output);
        if(abs(output-matrices[1][i][0])<0.00001){
            // std::cout<<"+\n";
            ++right_guesses;
        }
    }

    out<<"Accuracy: "<<(double)right_guesses/all_guesses<<'\n';
}